

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O3

void dataDeviceHandleSelection(void *userData,wl_data_device *device,wl_data_offer *offer)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  PFN_wl_proxy_marshal_flags p_Var3;
  wl_data_offer *pwVar4;
  uint32_t uVar5;
  long lVar6;
  
  p_Var3 = _glfw.wl.client.proxy_marshal_flags;
  pwVar4 = _glfw.wl.selectionOffer;
  if (_glfw.wl.selectionOffer != (wl_data_offer *)0x0) {
    uVar5 = (*_glfw.wl.client.proxy_get_version)((wl_proxy *)_glfw.wl.selectionOffer);
    (*p_Var3)((wl_proxy *)pwVar4,2,(wl_interface *)0x0,uVar5,1);
    _glfw.wl.selectionOffer = (wl_data_offer *)0x0;
  }
  p_Var3 = _glfw.wl.client.proxy_marshal_flags;
  if ((ulong)_glfw.wl.offerCount != 0) {
    lVar6 = 0;
    do {
      if (*(wl_data_offer **)((long)&(_glfw.wl.offers)->offer + lVar6) == offer) {
        pwVar4 = offer;
        if (*(int *)((long)&(_glfw.wl.offers)->text_plain_utf8 + lVar6) == 0) {
          uVar5 = (*_glfw.wl.client.proxy_get_version)((wl_proxy *)offer);
          (*p_Var3)((wl_proxy *)offer,2,(wl_interface *)0x0,uVar5,1);
          pwVar4 = _glfw.wl.selectionOffer;
        }
        _glfw.wl.selectionOffer = pwVar4;
        uVar2 = *(undefined8 *)&_glfw.wl.offers[_glfw.wl.offerCount - 1].text_plain_utf8;
        puVar1 = (undefined8 *)((long)&(_glfw.wl.offers)->offer + lVar6);
        *puVar1 = _glfw.wl.offers[_glfw.wl.offerCount - 1].offer;
        puVar1[1] = uVar2;
        _glfw.wl.offerCount = _glfw.wl.offerCount - 1;
        return;
      }
      lVar6 = lVar6 + 0x10;
    } while ((ulong)_glfw.wl.offerCount << 4 != lVar6);
  }
  return;
}

Assistant:

static void dataDeviceHandleSelection(void* userData,
                                      struct wl_data_device* device,
                                      struct wl_data_offer* offer)
{
    if (_glfw.wl.selectionOffer)
    {
        wl_data_offer_destroy(_glfw.wl.selectionOffer);
        _glfw.wl.selectionOffer = NULL;
    }

    for (unsigned int i = 0; i < _glfw.wl.offerCount; i++)
    {
        if (_glfw.wl.offers[i].offer == offer)
        {
            if (_glfw.wl.offers[i].text_plain_utf8)
                _glfw.wl.selectionOffer = offer;
            else
                wl_data_offer_destroy(offer);

            _glfw.wl.offers[i] = _glfw.wl.offers[_glfw.wl.offerCount - 1];
            _glfw.wl.offerCount--;
            break;
        }
    }
}